

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall SmallArray<unsigned_char,_8U>::~SmallArray(SmallArray<unsigned_char,_8U> *this)

{
  uchar *puVar1;
  
  puVar1 = this->data;
  if (puVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (puVar1 != (uchar *)0x0) {
        (*(code *)NULLC::dealloc)(puVar1);
      }
    }
    else if (puVar1 != (uchar *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}